

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O3

SQInteger sqstd_rex_parsenumber(SQRex *exp)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = exp->_p;
  lVar2 = (long)*pcVar3 + -0x30;
  exp->_p = pcVar3 + 1;
  if ((int)pcVar3[1] - 0x30U < 10) {
    pcVar3 = pcVar3 + 2;
    lVar4 = 10;
    do {
      exp->_p = pcVar3;
      if (lVar4 == 1000000000) {
        if (exp->_error != (SQChar **)0x0) {
          *exp->_error = "overflow in numeric constant";
        }
        longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
      }
      lVar2 = (long)pcVar3[-1] + lVar2 * 10 + -0x30;
      lVar4 = lVar4 * 10;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while ((int)cVar1 - 0x30U < 10);
  }
  return lVar2;
}

Assistant:

static SQInteger sqstd_rex_parsenumber(SQRex *exp)
{
    SQInteger ret = *exp->_p-'0';
    SQInteger positions = 10;
    exp->_p++;
    while(isdigit(*exp->_p)) {
        ret = ret*10+(*exp->_p++-'0');
        if(positions==1000000000) sqstd_rex_error(exp,_SC("overflow in numeric constant"));
        positions *= 10;
    };
    return ret;
}